

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getBasicVariablesInterface(Highs *this,HighsInt *basic_variables)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  long in_RSI;
  long in_RDI;
  HighsCallback *callback;
  HighsOptions *options;
  HighsInt var;
  HighsInt row;
  bool only_from_known_basis;
  HighsLpSolverObject solver_object;
  HighsSimplexStatus *ekk_status;
  HighsInt num_col;
  HighsInt num_row;
  HighsLp *lp;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffee0;
  int iVar5;
  undefined4 in_stack_fffffffffffffee4;
  HighsStatus in_stack_fffffffffffffee8;
  HighsStatus in_stack_fffffffffffffeec;
  HighsLogOptions *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff87;
  HighsBasis *in_stack_ffffffffffffff88;
  HighsStatus local_1c;
  HighsStatus local_4;
  
  local_1c = kOk;
  iVar1 = *(int *)(in_RDI + 0x13c);
  iVar2 = ((HighsLp *)(in_RDI + 0x138))->num_col_;
  if (iVar1 == 0) {
    local_4 = kOk;
  }
  else if ((*(byte *)(in_RDI + 0x70) & 1) == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "getBasicVariables called without a HiGHS basis\n");
    local_4 = kError;
  }
  else {
    if ((*(byte *)(in_RDI + 0x3850) & 1) == 0) {
      callback = (HighsCallback *)(in_RDI + 0x9a8);
      options = (HighsOptions *)(in_RDI + 0xaa8);
      HighsLpSolverObject::HighsLpSolverObject
                ((HighsLpSolverObject *)&stack0xffffffffffffff80,(HighsLp *)(in_RDI + 0x138),
                 (HighsBasis *)(in_RDI + 0x70),(HighsSolution *)(in_RDI + 8),
                 (HighsInfo *)(in_RDI + 0xea8),(HEkk *)(in_RDI + 0x12f8),callback,options,
                 (HighsTimer *)(in_RDI + 0x920));
      HighsLogOptions::HighsLogOptions((HighsLogOptions *)options,(HighsLogOptions *)callback);
      formSimplexLpBasisAndFactor
                ((HighsLpSolverObject *)in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffee8,"formSimplexLpBasisAndFactor",
                 (allocator *)&stack0xfffffffffffffee7);
      local_1c = interpretCallStatus(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                                     in_stack_fffffffffffffee8,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4dd856);
      if (local_1c != kOk) {
        return local_1c;
      }
    }
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3c70),(long)iVar5);
      iVar3 = *pvVar4;
      if (iVar3 < iVar2) {
        *(int *)(in_RSI + (long)iVar5 * 4) = iVar3;
      }
      else {
        *(int *)(in_RSI + (long)iVar5 * 4) = -((iVar3 + 1) - iVar2);
      }
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getBasicVariablesInterface(HighsInt* basic_variables) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_col = lp.num_col_;
  HighsSimplexStatus& ekk_status = ekk_instance_.status_;
  // For an LP with no rows the solution is vacuous
  if (num_row == 0) return return_status;
  if (!basis_.valid) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "getBasicVariables called without a HiGHS basis\n");
    return HighsStatus::kError;
  }
  if (!ekk_status.has_invert) {
    // The LP has no invert to use, so have to set one up, but only
    // for the current basis, so return_value is the rank deficiency.
    HighsLpSolverObject solver_object(lp, basis_, solution_, info_,
                                      ekk_instance_, callback_, options_,
                                      timer_);
    const bool only_from_known_basis = true;
    return_status = interpretCallStatus(
        options_.log_options,
        formSimplexLpBasisAndFactor(solver_object, only_from_known_basis),
        return_status, "formSimplexLpBasisAndFactor");
    if (return_status != HighsStatus::kOk) return return_status;
  }
  assert(ekk_status.has_invert);

  for (HighsInt row = 0; row < num_row; row++) {
    HighsInt var = ekk_instance_.basis_.basicIndex_[row];
    if (var < num_col) {
      basic_variables[row] = var;
    } else {
      basic_variables[row] = -(1 + var - num_col);
    }
  }
  return return_status;
}